

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_rawget(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *val;
  SQRESULT SVar4;
  SQInteger local_48;
  SQObjectPtr *obj;
  SQObjectPtr *self;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  pSVar3 = stack_get(v,idx);
  val = SQVM::GetUp(v,-1);
  SVar1 = (pSVar3->super_SQObject)._type;
  if (SVar1 == OT_ARRAY) {
    if (((val->super_SQObject)._type & 0x4000000) == 0) {
      SQVM::Pop(v);
      SVar4 = sq_throwerror(v,"invalid index type for an array");
      return SVar4;
    }
    if ((val->super_SQObject)._type == OT_FLOAT) {
      local_48 = (SQInteger)(val->super_SQObject)._unVal.fFloat;
    }
    else {
      local_48 = (val->super_SQObject)._unVal.nInteger;
    }
    bVar2 = SQArray::Get((pSVar3->super_SQObject)._unVal.pArray,local_48,val);
    if (bVar2) {
      return 0;
    }
  }
  else if (SVar1 == OT_CLASS) {
    bVar2 = SQClass::Get((pSVar3->super_SQObject)._unVal.pClass,val,val);
    if (bVar2) {
      return 0;
    }
  }
  else if (SVar1 == OT_TABLE) {
    bVar2 = SQTable::Get((pSVar3->super_SQObject)._unVal.pTable,val,val);
    if (bVar2) {
      return 0;
    }
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      SQVM::Pop(v);
      SVar4 = sq_throwerror(v,"rawget works only on array/table/instance and class");
      return SVar4;
    }
    bVar2 = SQInstance::Get((pSVar3->super_SQObject)._unVal.pInstance,val,val);
    if (bVar2) {
      return 0;
    }
  }
  SQVM::Pop(v);
  SVar4 = sq_throwerror(v,"the index doesn\'t exist");
  return SVar4;
}

Assistant:

SQRESULT sq_rawget(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    SQObjectPtr &obj = v->GetUp(-1);
    switch(sq_type(self)) {
    case OT_TABLE:
        if(_table(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_CLASS:
        if(_class(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_INSTANCE:
        if(_instance(self)->Get(obj,obj))
            return SQ_OK;
        break;
    case OT_ARRAY:{
        if(sq_isnumeric(obj)){
            if(_array(self)->Get(tointeger(obj),obj)) {
                return SQ_OK;
            }
        }
        else {
            v->Pop();
            return sq_throwerror(v,_SC("invalid index type for an array"));
        }
                  }
        break;
    default:
        v->Pop();
        return sq_throwerror(v,_SC("rawget works only on array/table/instance and class"));
    }
    v->Pop();
    return sq_throwerror(v,_SC("the index doesn't exist"));
}